

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

int __thiscall CTPNSuperclass::is_subclass_of(CTPNSuperclass *this,CTPNSuperclass *other)

{
  int iVar1;
  tc_symtype_t tVar2;
  tc_metaclass_t tVar3;
  CTcSymObjBase *this_00;
  CTPNSuperclass *in_RSI;
  long in_RDI;
  CTPNSuperclass *sc;
  CTcSymObj *sym;
  CTPNSuperclass *in_stack_ffffffffffffffc8;
  CTPNSuperclass *local_28;
  
  if ((in_RSI->sym_len_ == *(size_t *)(in_RDI + 0x28)) &&
     (iVar1 = memcmp(in_RSI->sym_txt_,*(void **)(in_RDI + 0x20),*(size_t *)(in_RDI + 0x28)),
     iVar1 == 0)) {
    return 1;
  }
  this_00 = (CTcSymObjBase *)get_sym(in_stack_ffffffffffffffc8);
  if (((this_00 != (CTcSymObjBase *)0x0) &&
      (tVar2 = CTcSymbolBase::get_type((CTcSymbolBase *)this_00), tVar2 == TC_SYM_OBJ)) &&
     (tVar3 = CTcSymObjBase::get_metaclass(this_00), tVar3 == TC_META_TADSOBJ)) {
    local_28 = CTcSymObjBase::get_sc_name_head(this_00);
    while( true ) {
      if (local_28 == (CTPNSuperclass *)0x0) {
        return 0;
      }
      iVar1 = is_subclass_of(in_RSI,(CTPNSuperclass *)this_00);
      if (iVar1 != 0) break;
      local_28 = local_28->nxt_;
    }
    return 1;
  }
  return 0;
}

Assistant:

int CTPNSuperclass::is_subclass_of(const CTPNSuperclass *other) const
{
    /* 
     *   if my name matches, we're a subclass (we are a subclass of
     *   ourselves) 
     */
    if (other->sym_len_ == sym_len_
        && memcmp(other->sym_txt_, sym_txt_, sym_len_) == 0)
        return TRUE;

    /* 
     *   We're a subclass if any of our superclasses are subclasses of the
     *   given object.  Get my object symbol, and make sure it's really a
     *   tads-object - if it's not, we're definitely not a subclass of
     *   anything.  
     */
    CTcSymObj *sym = (CTcSymObj *)get_sym();
    if (sym == 0
        || sym->get_type() != TC_SYM_OBJ
        || sym->get_metaclass() != TC_META_TADSOBJ)
        return FALSE;

    /* scan our symbol's superclass list for a match */
    for (CTPNSuperclass *sc = sym->get_sc_name_head() ;
         sc != 0 ; sc = sc->nxt_)
    {
        /* 
         *   if this one's a subclass of the given class, we're a subclass
         *   as well, since we're a subclass of this superclass 
         */
        if (sc->is_subclass_of(other))
            return TRUE;
    }

    /* 
     *   we didn't find any superclass that's a subclass of the given
     *   class, so we're not a subclass of the given class 
     */
    return FALSE;
}